

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Basic.cpp
# Opt level: O2

void __thiscall ObserverManager_Clear_Test::TestBody(ObserverManager_Clear_Test *this)

{
  A *this_00;
  A *this_01;
  char *message;
  AssertHelper AStack_1d8;
  string local_1d0;
  AssertionResult gtest_ar;
  stringstream out;
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&out);
  this_00 = (A *)operator_new(0x38);
  std::__cxx11::string::string((string *)&local_1d0,"Tic",(allocator *)&gtest_ar);
  A::A(this_00,local_190,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  ObserverManager::subscribe<FooBarProtocol,A>(this_00);
  this_01 = (A *)operator_new(0x38);
  std::__cxx11::string::string((string *)&local_1d0,"Tic",(allocator *)&gtest_ar);
  A::A(this_01,local_190,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  ObserverManager::subscribe<FooBarProtocol,A>(this_01);
  ObserverManager::notify<FooBarProtocol>((ObserverManager *)0x11,0);
  ObserverManager::notify<FooBarProtocol,std::__cxx11::string_const&,char_const*>
            ((ObserverManager *)0x19,0,"Tac");
  ObserverManager::clear<FooBarProtocol>();
  ObserverManager::notify<FooBarProtocol>((ObserverManager *)0x11,0);
  ObserverManager::notify<FooBarProtocol,std::__cxx11::string_const&,char_const*>
            ((ObserverManager *)0x19,0,"Tac");
  (*(this_00->super_FooBarProtocol).super_BaseObserverProtocol._vptr_BaseObserverProtocol[1])
            (this_00);
  (*(this_01->super_FooBarProtocol).super_BaseObserverProtocol._vptr_BaseObserverProtocol[1])
            (this_01);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<char[17],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"Tic Tic Tac Tac \"","out.str()",
             (char (*) [17])"Tic Tic Tac Tac ",&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1d0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/fnz[P]ObserverManager/Tests/Basic.cpp"
               ,0x8d,message);
    testing::internal::AssertHelper::operator=(&AStack_1d8,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_1d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::stringstream::~stringstream((stringstream *)&out);
  return;
}

Assistant:

TEST(ObserverManager, Clear)  {
    std::stringstream out;

    A* a1 = new A(out, "Tic");
    ObserverManager::subscribe<FooBarProtocol>(a1);
    
    A* a2 = new A(out, "Tic");
    ObserverManager::subscribe<FooBarProtocol>(a2);
    
    ObserverManager::notify(&FooBarProtocol::foo);
    ObserverManager::notify(&FooBarProtocol::bar, "Tac");
    
    ObserverManager::clear<FooBarProtocol>();
    
    ObserverManager::notify(&FooBarProtocol::foo);
    ObserverManager::notify(&FooBarProtocol::bar, "Tac");

    delete a1;
    delete a2;

    EXPECT_EQ("Tic Tic Tac Tac ", out.str());
}